

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O0

Gli_Obj_t * Gli_ObjAlloc(Gli_Man_t *p,int nFanins,int nFanouts)

{
  int iVar1;
  Gli_Obj_t *pObj_00;
  Gli_Obj_t *pObj;
  int nFanouts_local;
  int nFanins_local;
  Gli_Man_t *p_local;
  
  pObj_00 = Gli_ManObj(p,p->iObjData);
  pObj_00->Handle = p->iObjData;
  *(uint *)pObj_00 = *(uint *)pObj_00 & 0xffffff8f | (nFanins & 7U) << 4;
  *(uint *)pObj_00 = *(uint *)pObj_00 & 0x7f | nFanouts << 7;
  iVar1 = Gli_ObjSize(pObj_00);
  p->iObjData = iVar1 + p->iObjData;
  p->nObjs = p->nObjs + 1;
  return pObj_00;
}

Assistant:

Gli_Obj_t * Gli_ObjAlloc( Gli_Man_t * p, int nFanins, int nFanouts )
{
    Gli_Obj_t * pObj;
    pObj = Gli_ManObj( p, p->iObjData );
    pObj->Handle   = p->iObjData;
    pObj->nFanins  = nFanins;
    pObj->nFanouts = nFanouts;
    p->iObjData += Gli_ObjSize( pObj );
    p->nObjs++;
    return pObj;
}